

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::save_file_impl
               (xml_document *doc,FILE *file,char_t *indent,uint flags,xml_encoding encoding)

{
  int iVar1;
  FILE *in_RSI;
  xml_writer_file writer;
  xml_encoding in_stack_000027c8;
  uint in_stack_000027cc;
  char_t *in_stack_000027d0;
  xml_writer *in_stack_000027d8;
  xml_document *in_stack_000027e0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  xml_writer_file local_38 [2];
  FILE *local_18;
  byte local_1;
  
  if (in_RSI == (FILE *)0x0) {
    local_1 = 0;
  }
  else {
    local_18 = in_RSI;
    xml_writer_file::xml_writer_file
              (local_38,(void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    xml_document::save(in_stack_000027e0,in_stack_000027d8,in_stack_000027d0,in_stack_000027cc,
                       in_stack_000027c8);
    iVar1 = fflush(local_18);
    local_1 = false;
    if (iVar1 == 0) {
      iVar1 = ferror(local_18);
      local_1 = iVar1 == 0;
    }
    xml_writer_file::~xml_writer_file((xml_writer_file *)0xecfc58);
  }
  return (bool)(local_1 & 1);
}

Assistant:

PUGI_IMPL_FN bool save_file_impl(const xml_document& doc, FILE* file, const char_t* indent, unsigned int flags, xml_encoding encoding)
	{
		if (!file) return false;

		xml_writer_file writer(file);
		doc.save(writer, indent, flags, encoding);

		return fflush(file) == 0 && ferror(file) == 0;
	}